

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu2.c
# Opt level: O3

MPP_RET hal_m2vd_vdpu2_wait(void *hal,HalTaskInfo *task)

{
  long lVar1;
  MPP_RET MVar2;
  ulong uVar3;
  M2vdVdpu2Reg *reg_out;
  long local_38;
  
  lVar1 = *(long *)((long)hal + 0x68);
  local_38 = lVar1;
  if ((m2vh_debug & 1) != 0) {
    _mpp_log_l(4,"hal_m2vd_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0x17d,
               "hal_m2vd_vdpu2_wait");
  }
  MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x90),0x10,(void *)0x0);
  if (MVar2 != MPP_OK) {
    _mpp_log_l(2,"hal_m2vd_vdpu2","poll cmd failed %d\n","hal_m2vd_vdpu2_wait",(ulong)(uint)MVar2);
  }
  if (*(FILE **)((long)hal + 0xa0) != (FILE *)0x0) {
    fprintf(*(FILE **)((long)hal + 0xa0),"Frame #%d\n",(ulong)*(uint *)((long)hal + 0x80));
    uVar3 = 0;
    do {
      fprintf(*(FILE **)((long)hal + 0xa0),"[(D)%03d, (X)%03x]  %08x\n",uVar3 & 0xffffffff,
              uVar3 & 0xffffffff,(ulong)*(uint *)((long)&local_38 + uVar3 * 4));
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x9f);
    fflush(*(FILE **)((long)hal + 0xa0));
  }
  if (((*(ushort *)(lVar1 + 0xdc) & 0x1040) != 0) &&
     (*(MppCbCtx **)((long)hal + 0x88) != (MppCbCtx *)0x0)) {
    mpp_callback_f("hal_m2vd_vdpu2_wait",*(MppCbCtx **)((long)hal + 0x88),(void *)0x0);
  }
  if ((m2vh_debug & 8) != 0) {
    _mpp_log_l(4,"hal_m2vd_vdpu2","mpp_device_wait_reg return interrupt:%08x",(char *)0x0,
               (ulong)*(uint *)(lVar1 + 0xdc));
  }
  if ((m2vh_debug & 1) != 0) {
    _mpp_log_l(4,"hal_m2vd_vdpu2","%s: line(%d), func(%s)",(char *)0x0,"leave\n",0x194,
               "hal_m2vd_vdpu2_wait");
  }
  return MVar2;
}

Assistant:

MPP_RET hal_m2vd_vdpu2_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    M2vdHalCtx *ctx = (M2vdHalCtx *)hal;
    M2vdVdpu2Reg* reg_out = (M2vdVdpu2Reg * )ctx->regs;

    m2vh_dbg_func("enter\n");

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

    if (ctx->fp_reg_out) {
        int k = 0;
        RK_U32 *p_reg = (RK_U32*)&reg_out;
        fprintf(ctx->fp_reg_out, "Frame #%d\n", ctx->dec_frame_cnt);
        for (k = 0; k < M2VD_VDPU2_REG_NUM; k++)
            fprintf(ctx->fp_reg_out, "[(D)%03d, (X)%03x]  %08x\n", k, k, p_reg[k]);
        fflush(ctx->fp_reg_out);
    }
    if (reg_out->sw55.dec_error_int | reg_out->sw55.dec_buffer_int) {
        if (ctx->dec_cb)
            mpp_callback(ctx->dec_cb, NULL);
    }

    if (M2VH_DBG_IRQ & m2vh_debug)
        mpp_log("mpp_device_wait_reg return interrupt:%08x", reg_out->sw55);

    (void)task;
    m2vh_dbg_func("leave\n");
    return ret;
}